

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Abc_Ntk_t * Abc_SclUnBufferPerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  void **ppvVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint *__ptr;
  void *__s;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  ulong uVar14;
  
  pVVar12 = pNtk->vObjs;
  uVar1 = pVVar12->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  *__ptr = uVar7;
  if (uVar7 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar1;
  }
  else {
    __s = malloc((long)(int)uVar7 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = uVar1;
    if (__s != (void *)0x0) {
      memset(__s,0xff,(long)(int)uVar1 << 2);
      goto LAB_00429ed0;
    }
  }
  __s = (void *)0x0;
LAB_00429ed0:
  if (0 < (int)uVar1) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar12->pArray[lVar13];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        iVar6 = Abc_SclIsInv(pAVar2);
        if (iVar6 != 0) {
          uVar7 = *(pAVar2->vFanins).pArray;
          pvVar3 = pAVar2->pNtk->vObjs->pArray[(int)uVar7];
          if (((*(uint *)((long)pvVar3 + 0x14) & 0xf) != 7) || (*(int *)((long)pvVar3 + 0x1c) != 1))
          {
            if (uVar1 <= uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)(int)uVar7 * 4) = pAVar2->Id;
          }
        }
      }
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar13 < pVVar12->nSize);
    if (0 < pVVar12->nSize) {
      uVar10 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar12->pArray[uVar10];
        if (((pAVar2 != (Abc_Obj_t *)0x0) && (uVar7 = *(uint *)&pAVar2->field_0x14 & 0xf, uVar7 < 8)
            ) && ((0x98U >> uVar7 & 1) != 0)) {
          if (uVar1 <= uVar10) break;
          if (0 < (pAVar2->vFanins).nSize) {
            lVar13 = 0;
            do {
              pObj = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar13]];
              if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
                uVar8 = Abc_SclGetRealFaninLit(pObj);
                uVar11 = uVar8 >> 1;
                uVar7 = pNtk->vObjs->nSize;
                if ((int)uVar7 <= (int)uVar11) {
LAB_0042a0d5:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                ppvVar4 = pNtk->vObjs->pArray;
                uVar14 = (ulong)uVar11;
                pFanin = (Abc_Obj_t *)ppvVar4[uVar14];
                if ((uVar8 & 1) != 0) {
                  if ((int)__ptr[1] <= (int)uVar11) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  lVar5 = *(long *)(__ptr + 2);
                  uVar8 = *(uint *)(lVar5 + uVar14 * 4);
                  if ((ulong)uVar8 == 0xffffffff) {
                    pFanin = Abc_NtkCreateNodeInv(pNtk,pFanin);
                    *(int *)(lVar5 + uVar14 * 4) = pFanin->Id;
                  }
                  else {
                    if (((int)uVar8 < 0) || (uVar7 <= uVar8)) goto LAB_0042a0d5;
                    pFanin = (Abc_Obj_t *)ppvVar4[uVar8];
                  }
                  if ((pFanin->vFanins).nSize != 1) {
                    __assert_fail("Abc_ObjFaninNum(pFaninNew) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                                  ,0x9f,"Abc_Ntk_t *Abc_SclUnBufferPerform(Abc_Ntk_t *, int)");
                  }
                }
                if (pObj != pFanin) {
                  Abc_ObjPatchFanin(pAVar2,pObj,pFanin);
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < (pAVar2->vFanins).nSize);
            pVVar12 = pNtk->vObjs;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)pVVar12->nSize);
      __s = *(void **)(__ptr + 2);
    }
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(__ptr);
  pAVar9 = Abc_NtkDupDfs(pNtk);
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, nNodesOld = Abc_NtkObjNumMax(pNtk);
    // assign inverters
    vLits = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_SclIsInv(pObj) && !Abc_SclObjIsBufInv(Abc_ObjFanin0(pObj)) )
            Vec_IntWriteEntry( vLits, Abc_ObjFaninId0(pObj), Abc_ObjId(pObj) );
    // transfer fanins
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_SclObjIsBufInv(pFanin) )
                continue;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( Abc_LitIsCompl(iLit) )
            {
                if ( Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) == -1 )
                {
                    pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFaninNew );
                    Vec_IntWriteEntry( vLits, Abc_Lit2Var(iLit), Abc_ObjId(pFaninNew) );
                }
                else
                    pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) );
                assert( Abc_ObjFaninNum(pFaninNew) == 1 );
            }
            if ( pFanin != pFaninNew )
                Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
        }
    }
    Vec_IntFree( vLits );
    // duplicate network in topo order
    return Abc_NtkDupDfs( pNtk );
}